

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strand.cpp
# Opt level: O2

void __thiscall Printer::Printer(Printer *this,io_context *io_context)

{
  executor_binder<std::_Bind<void_(Printer::*(Printer_*))()>,_boost::asio::io_context::strand>
  local_58;
  
  boost::asio::io_context::strand::strand(&this->strand_,io_context);
  local_58.
  super_executor_binder_base<std::_Bind<void_(Printer::*(Printer_*))()>,_boost::asio::io_context::strand,_false>
  .executor_.service_ = (strand_service *)0x3b9aca00;
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_waitable_timer<boost::asio::io_context>
            (&this->timer1_,io_context,(duration *)&local_58,(type *)0x0);
  local_58.
  super_executor_binder_base<std::_Bind<void_(Printer::*(Printer_*))()>,_boost::asio::io_context::strand,_false>
  .executor_.service_ = (strand_service *)0x3b9aca00;
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_waitable_timer<boost::asio::io_context>
            (&this->timer2_,io_context,(duration *)&local_58,(type *)0x0);
  this->count_ = 0;
  local_58.
  super_executor_binder_base<std::_Bind<void_(Printer::*(Printer_*))()>,_boost::asio::io_context::strand,_false>
  .executor_.service_ = (this->strand_).service_;
  local_58.
  super_executor_binder_base<std::_Bind<void_(Printer::*(Printer_*))()>,_boost::asio::io_context::strand,_false>
  .executor_.impl_ = (this->strand_).impl_;
  local_58.
  super_executor_binder_base<std::_Bind<void_(Printer::*(Printer_*))()>,_boost::asio::io_context::strand,_false>
  .target_._M_f = (offset_in_Printer_to_subr)Print1;
  local_58.
  super_executor_binder_base<std::_Bind<void_(Printer::*(Printer_*))()>,_boost::asio::io_context::strand,_false>
  .target_._8_8_ = 0;
  local_58.
  super_executor_binder_base<std::_Bind<void_(Printer::*(Printer_*))()>,_boost::asio::io_context::strand,_false>
  .target_._M_bound_args.super__Tuple_impl<0UL,_Printer_*>.super__Head_base<0UL,_Printer_*,_false>.
  _M_head_impl = (_Tuple_impl<0UL,_Printer_*>)(_Tuple_impl<0UL,_Printer_*>)this;
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,boost::asio::wait_traits<std::chrono::_V2::steady_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::
  async_wait<boost::asio::executor_binder<std::_Bind<void(Printer::*(Printer*))()>,boost::asio::io_context::strand>>
            ((basic_waitable_timer<std::chrono::_V2::steady_clock,boost::asio::wait_traits<std::chrono::_V2::steady_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)&this->timer1_,&local_58);
  local_58.
  super_executor_binder_base<std::_Bind<void_(Printer::*(Printer_*))()>,_boost::asio::io_context::strand,_false>
  .executor_.service_ = (this->strand_).service_;
  local_58.
  super_executor_binder_base<std::_Bind<void_(Printer::*(Printer_*))()>,_boost::asio::io_context::strand,_false>
  .executor_.impl_ = (this->strand_).impl_;
  local_58.
  super_executor_binder_base<std::_Bind<void_(Printer::*(Printer_*))()>,_boost::asio::io_context::strand,_false>
  .target_._M_f = (offset_in_Printer_to_subr)Print2;
  local_58.
  super_executor_binder_base<std::_Bind<void_(Printer::*(Printer_*))()>,_boost::asio::io_context::strand,_false>
  .target_._8_8_ = 0;
  local_58.
  super_executor_binder_base<std::_Bind<void_(Printer::*(Printer_*))()>,_boost::asio::io_context::strand,_false>
  .target_._M_bound_args.super__Tuple_impl<0UL,_Printer_*>.super__Head_base<0UL,_Printer_*,_false>.
  _M_head_impl = (_Tuple_impl<0UL,_Printer_*>)(_Tuple_impl<0UL,_Printer_*>)this;
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,boost::asio::wait_traits<std::chrono::_V2::steady_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::
  async_wait<boost::asio::executor_binder<std::_Bind<void(Printer::*(Printer*))()>,boost::asio::io_context::strand>>
            ((basic_waitable_timer<std::chrono::_V2::steady_clock,boost::asio::wait_traits<std::chrono::_V2::steady_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)&this->timer2_,&local_58);
  return;
}

Assistant:

explicit Printer(boost::asio::io_context& io_context)
      : strand_(io_context),
        timer1_(io_context, std::chrono::seconds(1)),
        timer2_(io_context, std::chrono::seconds(1)) {
    timer1_.async_wait(
        boost::asio::bind_executor(strand_, std::bind(&Printer::Print1, this)));
    timer2_.async_wait(
        boost::asio::bind_executor(strand_, std::bind(&Printer::Print2, this)));
  }